

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O0

bool __thiscall
mocker::detail::InterferenceGraph::conservative(InterferenceGraph *this,Node *x,Node *y)

{
  __node_base_ptr *__return_storage_ptr__;
  bool bVar1;
  reference __k;
  mapped_type *pmVar2;
  shared_ptr<mocker::nasm::Register> *m;
  iterator __end2;
  iterator __begin2;
  RegSet *__range2;
  size_t k;
  allocator<std::shared_ptr<mocker::nasm::Register>_> local_83;
  key_equal local_82;
  hasher local_81;
  __normal_iterator<std::shared_ptr<mocker::nasm::Register>_*,_std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>
  local_80;
  __normal_iterator<std::shared_ptr<mocker::nasm::Register>_*,_std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>
  local_78;
  undefined1 local_70 [8];
  RegSet neighbors;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  neighborsOfX;
  Node *y_local;
  Node *x_local;
  InterferenceGraph *this_local;
  
  __return_storage_ptr__ = &neighbors._M_h._M_single_bucket;
  getCurAdjList((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 *)__return_storage_ptr__,this,x);
  local_78._M_current =
       (shared_ptr<mocker::nasm::Register> *)
       std::
       vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
       ::begin((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                *)__return_storage_ptr__);
  local_80._M_current =
       (shared_ptr<mocker::nasm::Register> *)
       std::
       vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
       ::end((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
              *)__return_storage_ptr__);
  std::allocator<std::shared_ptr<mocker::nasm::Register>_>::allocator(&local_83);
  std::
  unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>
  ::
  unordered_set<__gnu_cxx::__normal_iterator<std::shared_ptr<mocker::nasm::Register>*,std::vector<std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>>>>
            ((unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>
              *)local_70,local_78,local_80,0,&local_81,&local_82,&local_83);
  std::allocator<std::shared_ptr<mocker::nasm::Register>_>::~allocator(&local_83);
  getCurAdjList((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 *)&k,this,y);
  unionSet<std::unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>,std::vector<std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>>>
            ((unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
              *)local_70,
             (vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
              *)&k);
  std::
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  ::~vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
             *)&k);
  __range2 = (RegSet *)0x0;
  __end2 = std::
           unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
           ::begin((unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    *)local_70);
  m = (shared_ptr<mocker::nasm::Register> *)
      std::
      unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
      ::end((unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
             *)local_70);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2.
                        super__Node_iterator_base<std::shared_ptr<mocker::nasm::Register>,_true>,
                       (_Node_iterator_base<std::shared_ptr<mocker::nasm::Register>,_true> *)&m);
    if (!bVar1) break;
    __k = std::__detail::_Node_iterator<std::shared_ptr<mocker::nasm::Register>,_true,_true>::
          operator*(&__end2);
    pmVar2 = std::
             unordered_map<std::shared_ptr<mocker::nasm::Register>,_unsigned_long,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>_>
             ::at(&this->curDegree,__k);
    if (0xd < *pmVar2) {
      __range2 = (RegSet *)((long)&(__range2->_M_h)._M_buckets + 1);
    }
    std::__detail::_Node_iterator<std::shared_ptr<mocker::nasm::Register>,_true,_true>::operator++
              (&__end2);
  }
  std::
  unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  ::~unordered_set((unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    *)local_70);
  std::
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  ::~vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
             *)&neighbors._M_h._M_single_bucket);
  return __range2 < (RegSet *)0xe;
}

Assistant:

bool InterferenceGraph::conservative(const Node &x, const Node &y) const {
  auto neighborsOfX = getCurAdjList(x);
  RegSet neighbors(neighborsOfX.begin(), neighborsOfX.end());
  unionSet(neighbors, getCurAdjList(y));
  std::size_t k = 0;
  for (auto &m : neighbors) {
    if (curDegree.at(m) >= K)
      ++k;
  }
  return k < K;
}